

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O0

yrmcds_error yrmcds_cnt_connect(yrmcds_cnt *c,char *node,uint16_t port)

{
  yrmcds_error yVar1;
  yrmcds_error *pyVar2;
  void *pvVar3;
  int local_2c;
  yrmcds_error err;
  int server_fd;
  int e;
  uint16_t port_local;
  char *node_local;
  yrmcds_cnt *c_local;
  
  if (c == (yrmcds_cnt *)0x0) {
    c_local._4_4_ = YRMCDS_BAD_ARGUMENT;
  }
  else {
    server_fd._2_2_ = port;
    _e = node;
    node_local = (char *)c;
    yVar1 = pthread_mutex_init((pthread_mutex_t *)c,(pthread_mutexattr_t *)0x0);
    err = yVar1;
    if (yVar1 == YRMCDS_OK) {
      c_local._4_4_ = connect_to_server(_e,server_fd._2_2_,&local_2c);
      if (c_local._4_4_ == YRMCDS_OK) {
        *(int *)(node_local + 0x60) = local_2c;
        node_local[0x68] = '\0';
        node_local[0x69] = '\0';
        node_local[0x6a] = '\0';
        node_local[0x6b] = '\0';
        pvVar3 = malloc(0x1000);
        *(void **)(node_local + 0x40) = pvVar3;
        if (*(long *)(node_local + 0x40) == 0) {
          close(local_2c);
          pthread_mutex_destroy((pthread_mutex_t *)node_local);
          c_local._4_4_ = YRMCDS_OUT_OF_MEMORY;
        }
        else {
          node_local[0x48] = '\0';
          node_local[0x49] = '\x10';
          node_local[0x4a] = '\0';
          node_local[0x4b] = '\0';
          node_local[0x4c] = '\0';
          node_local[0x4d] = '\0';
          node_local[0x4e] = '\0';
          node_local[0x4f] = '\0';
          node_local[0x50] = '\0';
          node_local[0x51] = '\0';
          node_local[0x52] = '\0';
          node_local[0x53] = '\0';
          node_local[0x54] = '\0';
          node_local[0x55] = '\0';
          node_local[0x56] = '\0';
          node_local[0x57] = '\0';
          node_local[0x58] = '\0';
          node_local[0x59] = '\0';
          node_local[0x5a] = '\0';
          node_local[0x5b] = '\0';
          node_local[0x5c] = '\0';
          node_local[0x5d] = '\0';
          node_local[0x5e] = '\0';
          node_local[0x5f] = '\0';
          node_local[100] = '\0';
          node_local[0x65] = '\0';
          node_local[0x66] = '\0';
          node_local[0x67] = '\0';
          node_local[0x38] = '\0';
          node_local[0x39] = '\0';
          node_local[0x3a] = '\0';
          node_local[0x3b] = '\0';
          node_local[0x3c] = '\0';
          node_local[0x3d] = '\0';
          node_local[0x3e] = '\0';
          node_local[0x3f] = '\0';
          node_local[0x30] = '\0';
          node_local[0x31] = '\0';
          node_local[0x32] = '\0';
          node_local[0x33] = '\0';
          node_local[0x34] = '\0';
          node_local[0x35] = '\0';
          node_local[0x36] = '\0';
          node_local[0x37] = '\0';
          node_local[0x28] = '\0';
          node_local[0x29] = '\0';
          node_local[0x2a] = '\0';
          node_local[0x2b] = '\0';
          node_local[0x2c] = '\0';
          node_local[0x2d] = '\0';
          node_local[0x2e] = '\0';
          node_local[0x2f] = '\0';
          c_local._4_4_ = YRMCDS_OK;
        }
      }
    }
    else {
      pyVar2 = (yrmcds_error *)__errno_location();
      *pyVar2 = yVar1;
      c_local._4_4_ = YRMCDS_SYSTEM_ERROR;
    }
  }
  return c_local._4_4_;
}

Assistant:

yrmcds_error yrmcds_cnt_connect(yrmcds_cnt* c, const char* node, uint16_t port) {
    if( c == NULL )
        return YRMCDS_BAD_ARGUMENT;
#ifndef LIBYRMCDS_NO_INTERNAL_LOCK
    int e = pthread_mutex_init(&(c->lock), NULL);
    if( e != 0 ) {
        errno = e;
        return YRMCDS_SYSTEM_ERROR;
    }
#endif // ! LIBYRMCDS_NO_INTERNAL_LOCK
    int server_fd;
    yrmcds_error err = connect_to_server(node, port, &server_fd);
    if( err != YRMCDS_OK )
        return err;
    c->sock = server_fd;
    c->serial = 0;
    c->recvbuf = (char*)malloc(4096);
    if( c->recvbuf == NULL ) {
        close(server_fd);
#ifndef LIBYRMCDS_NO_INTERNAL_LOCK
        pthread_mutex_destroy(&(c->lock));
#endif
        return YRMCDS_OUT_OF_MEMORY;
    }
    c->capacity = 4096;
    c->used = 0;
    c->last_size = 0;
    c->invalid = 0;
    c->stats.count = c->stats.capacity = 0;
    c->stats.records = NULL;
    return YRMCDS_OK;
}